

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O0

bool __thiscall MeCab::Viterbi::viterbi<false,false>(Viterbi *this,Lattice *lattice)

{
  bool bVar1;
  Connector *pCVar2;
  Allocator<mecab_node_t,_mecab_path_t> *pAVar3;
  mecab_node_t *pmVar4;
  char *pcVar5;
  mecab_node_t *pmVar6;
  Tokenizer<mecab_node_t,_mecab_path_t> *end_node_list_00;
  mecab_node_t *pmVar7;
  Node **begin_node_list_00;
  long lVar8;
  long *in_RSI;
  long in_RDI;
  Lattice *in_stack_00000048;
  Allocator<mecab_node_t,_mecab_path_t> *in_stack_00000050;
  char *in_stack_00000058;
  char *in_stack_00000060;
  Tokenizer<mecab_node_t,_mecab_path_t> *in_stack_00000068;
  long pos_1;
  Node *eos_node;
  Node *right_node;
  size_t pos;
  Node *bos_node;
  char *end;
  char *begin;
  size_t len;
  Allocator<mecab_node_t,_mecab_path_t> *allocator;
  Node **begin_node_list;
  Node **end_node_list;
  Allocator<mecab_node_t,_mecab_path_t> *in_stack_ffffffffffffff08;
  Tokenizer<mecab_node_t,_mecab_path_t> *in_stack_ffffffffffffff10;
  Allocator<mecab_node_t,_mecab_path_t> *in_stack_ffffffffffffff18;
  Tokenizer<mecab_node_t,_mecab_path_t> *in_stack_ffffffffffffff20;
  Allocator<mecab_node_t,_mecab_path_t> *in_stack_ffffffffffffff30;
  Allocator<mecab_node_t,_mecab_path_t> *allocator_00;
  Connector *in_stack_ffffffffffffff38;
  Connector *connector;
  Node **in_stack_ffffffffffffff40;
  Node **in_stack_ffffffffffffff48;
  Node *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff58;
  Allocator<mecab_node_t,_mecab_path_t> *pos_00;
  ulong local_70;
  ulong local_58;
  
  pCVar2 = (Connector *)(**(code **)(*in_RSI + 0x28))();
  pAVar3 = (Allocator<mecab_node_t,_mecab_path_t> *)(**(code **)(*in_RSI + 0x20))();
  (**(code **)(*in_RSI + 0xb0))();
  local_70 = (**(code **)(*in_RSI + 0x58))();
  (**(code **)(*in_RSI + 0x40))();
  scoped_ptr<MeCab::Tokenizer<mecab_node_t,_mecab_path_t>_>::operator->
            ((scoped_ptr<MeCab::Tokenizer<mecab_node_t,_mecab_path_t>_> *)(in_RDI + 8));
  (**(code **)(*in_RSI + 0xb0))();
  pmVar4 = Tokenizer<mecab_node_t,_mecab_path_t>::getBOSNode
                     (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  pcVar5 = (char *)(**(code **)(*in_RSI + 0x40))();
  pmVar4->surface = pcVar5;
  pCVar2->_vptr_Connector = (_func_int **)pmVar4;
  for (local_58 = 0; local_58 < local_70; local_58 = local_58 + 1) {
    if ((&pCVar2->_vptr_Connector)[local_58] != (_func_int **)0x0) {
      scoped_ptr<MeCab::Tokenizer<mecab_node_t,_mecab_path_t>_>::operator->
                ((scoped_ptr<MeCab::Tokenizer<mecab_node_t,_mecab_path_t>_> *)(in_RDI + 8));
      pmVar6 = Tokenizer<mecab_node_t,_mecab_path_t>::lookup<false>
                         (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000050,
                          in_stack_00000048);
      (&pAVar3->_vptr_Allocator)[local_58] = (_func_int **)pmVar6;
      scoped_ptr<MeCab::Connector>::get((scoped_ptr<MeCab::Connector> *)(in_RDI + 0x18));
      bVar1 = anon_unknown_14::connect<false>
                        (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                         in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                         in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      if (!bVar1) {
        (**(code **)(*in_RSI + 0x128))(in_RSI,"too long sentence.");
        return false;
      }
    }
  }
  end_node_list_00 =
       scoped_ptr<MeCab::Tokenizer<mecab_node_t,_mecab_path_t>_>::operator->
                 ((scoped_ptr<MeCab::Tokenizer<mecab_node_t,_mecab_path_t>_> *)(in_RDI + 8));
  (**(code **)(*in_RSI + 0xb0))();
  pmVar7 = Tokenizer<mecab_node_t,_mecab_path_t>::getEOSNode
                     (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  begin_node_list_00 = (Node **)(**(code **)(*in_RSI + 0x40))();
  lVar8 = (**(code **)(*in_RSI + 0x58))();
  pmVar7->surface = (char *)((long)begin_node_list_00 + lVar8);
  pmVar6 = pmVar7;
  pos_00 = pAVar3;
  lVar8 = (**(code **)(*in_RSI + 0x58))();
  (&pos_00->_vptr_Allocator)[lVar8] = (_func_int **)pmVar6;
  do {
    if ((long)local_70 < 0) {
LAB_0015f311:
      pCVar2->_vptr_Connector = (_func_int **)pmVar4;
      lVar8 = (**(code **)(*in_RSI + 0x58))();
      (&pAVar3->_vptr_Allocator)[lVar8] = (_func_int **)pmVar7;
      return true;
    }
    if ((&pCVar2->_vptr_Connector)[local_70] != (_func_int **)0x0) {
      allocator_00 = pAVar3;
      connector = pCVar2;
      scoped_ptr<MeCab::Connector>::get((scoped_ptr<MeCab::Connector> *)(in_RDI + 0x18));
      bVar1 = anon_unknown_14::connect<false>
                        ((size_t)pos_00,pmVar6,begin_node_list_00,(Node **)end_node_list_00,
                         connector,allocator_00);
      if (!bVar1) {
        (**(code **)(*in_RSI + 0x128))(in_RSI,"too long sentence.");
        return false;
      }
      goto LAB_0015f311;
    }
    local_70 = local_70 - 1;
  } while( true );
}

Assistant:

bool Viterbi::viterbi(Lattice *lattice) const {
  Node **end_node_list   = lattice->end_nodes();
  Node **begin_node_list = lattice->begin_nodes();
  Allocator<Node, Path> *allocator = lattice->allocator();
  const size_t len = lattice->size();
  const char *begin = lattice->sentence();
  const char *end = begin + len;

  Node *bos_node = tokenizer_->getBOSNode(lattice->allocator());
  bos_node->surface = lattice->sentence();
  end_node_list[0] = bos_node;

  for (size_t pos = 0; pos < len; ++pos) {
    if (end_node_list[pos]) {
      Node *right_node = tokenizer_->lookup<IsPartial>(begin + pos, end,
                                                       allocator, lattice);
      begin_node_list[pos] = right_node;
      if (!connect<IsAllPath>(pos, right_node,
                              begin_node_list,
                              end_node_list,
                              connector_.get(),
                              allocator)) {
        lattice->set_what("too long sentence.");
        return false;
      }
}
}

  Node *eos_node = tokenizer_->getEOSNode(lattice->allocator());
  eos_node->surface = lattice->sentence() + lattice->size();
  begin_node_list[lattice->size()] = eos_node;

  for (long pos = len; static_cast<long>(pos) >= 0; --pos) {
    if (end_node_list[pos]) {
      if (!connect<IsAllPath>(pos, eos_node,
                              begin_node_list,
                              end_node_list,
                              connector_.get(),
                              allocator)) {
        lattice->set_what("too long sentence.");
        return false;
      }
      break;
    }
  }

  end_node_list[0] = bos_node;
  begin_node_list[lattice->size()] = eos_node;

  return true;
}